

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

UBool icu_63::tzdbTimeZoneNames_cleanup(void)

{
  if (gTZDBNamesMap != (UHashtable *)0x0) {
    uhash_close_63(gTZDBNamesMap);
    gTZDBNamesMap = (UHashtable *)0x0;
  }
  LOCK();
  gTZDBNamesMapInitOnce = 0;
  UNLOCK();
  if (gTZDBNamesTrie != (long *)0x0) {
    (**(code **)(*gTZDBNamesTrie + 8))();
    gTZDBNamesTrie = (long *)0x0;
  }
  LOCK();
  gTZDBNamesTrieInitOnce = 0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV tzdbTimeZoneNames_cleanup(void) {
    if (gTZDBNamesMap != NULL) {
        uhash_close(gTZDBNamesMap);
        gTZDBNamesMap = NULL;
    }
    gTZDBNamesMapInitOnce.reset();

    if (gTZDBNamesTrie != NULL) {
        delete gTZDBNamesTrie;
        gTZDBNamesTrie = NULL;
    }
    gTZDBNamesTrieInitOnce.reset();

    return TRUE;
}